

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cba.h
# Opt level: O0

void Cba_ManFree(Cba_Man_t *p)

{
  int iVar1;
  Cba_Ntk_t *p_00;
  int local_1c;
  int i;
  Cba_Ntk_t *pNtk;
  Cba_Man_t *p_local;
  
  for (local_1c = 1; iVar1 = Cba_ManNtkNum(p), local_1c <= iVar1; local_1c = local_1c + 1) {
    p_00 = Cba_ManNtk(p,local_1c);
    Cba_NtkFree(p_00);
  }
  if ((p->vNtks).pArray != (void **)0x0) {
    free((p->vNtks).pArray);
    (p->vNtks).pArray = (void **)0x0;
  }
  Abc_NamDeref(p->pStrs);
  Abc_NamDeref(p->pFuns);
  Abc_NamDeref(p->pMods);
  Hash_IntManDeref(p->vHash);
  Vec_IntErase(&p->vNameMap);
  Vec_IntErase(&p->vUsed);
  Vec_IntErase(&p->vNameMap2);
  Vec_IntErase(&p->vUsed2);
  Vec_StrErase(&p->vOut);
  Vec_StrErase(&p->vOut2);
  if (p->pName != (char *)0x0) {
    free(p->pName);
    p->pName = (char *)0x0;
  }
  if (p->pSpec != (char *)0x0) {
    free(p->pSpec);
    p->pSpec = (char *)0x0;
  }
  if (p != (Cba_Man_t *)0x0) {
    free(p);
  }
  return;
}

Assistant:

static inline void Cba_ManFree( Cba_Man_t * p )
{
    Cba_Ntk_t * pNtk; int i;
    Cba_ManForEachNtk( p, pNtk, i )
        Cba_NtkFree( pNtk );
    ABC_FREE( p->vNtks.pArray );
    Abc_NamDeref( p->pStrs );
    Abc_NamDeref( p->pFuns );
    Abc_NamDeref( p->pMods );
    Hash_IntManDeref( p->vHash );
    Vec_IntErase( &p->vNameMap );
    Vec_IntErase( &p->vUsed );
    Vec_IntErase( &p->vNameMap2 );
    Vec_IntErase( &p->vUsed2 );
    Vec_StrErase( &p->vOut );
    Vec_StrErase( &p->vOut2 );
    ABC_FREE( p->pName );
    ABC_FREE( p->pSpec );
    ABC_FREE( p );
}